

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O0

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,SVOBitset *other)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  void *pvVar4;
  SVOBitset *in_RSI;
  unsigned_long_long *in_RDI;
  unsigned_long_long *unaff_retaddr;
  unsigned_long_long *__last;
  
  __last = in_RDI;
  bVar2 = _is_long(in_RSI);
  if (bVar2) {
    *(uint *)(in_RDI + 0x10) = in_RSI->n_words;
    auVar1 = ZEXT416((uint)in_RDI[0x10]) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *in_RDI = (unsigned_long_long)pvVar4;
    std::copy<unsigned_long_long*,unsigned_long_long*>
              (unaff_retaddr,__last,(unsigned_long_long *)in_RSI);
  }
  else {
    *(uint *)(in_RDI + 0x10) = in_RSI->n_words;
    std::copy<unsigned_long_long_const*,unsigned_long_long*>
              (unaff_retaddr,__last,(unsigned_long_long *)in_RSI);
  }
  return;
}

Assistant:

SVOBitset(const SVOBitset & other)
        {
            if (other._is_long()) {
                n_words = other.n_words;
                _data.long_data = new BitWord[n_words];
                std::copy(other._data.long_data, other._data.long_data + other.n_words, _data.long_data);
            }
            else {
                n_words = other.n_words;
                std::copy(&other._data.short_data[0], &other._data.short_data[svo_size], &_data.short_data[0]);
            }
        }